

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int session_set_handle_max(SESSION_HANDLE session,handle handle_max)

{
  if (session != (SESSION_HANDLE)0x0) {
    session->handle_max = handle_max;
    return 0;
  }
  return 0x425;
}

Assistant:

int session_set_handle_max(SESSION_HANDLE session, handle handle_max)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_instance->handle_max = handle_max;

        result = 0;
    }

    return result;
}